

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeMemFreeExt
          (ze_context_handle_t hContext,ze_memory_free_ext_desc_t *pMemFreeDesc,void *ptr)

{
  _func_void__ze_mem_free_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _func__ze_result_t__ze_context_handle_t_ptr__ze_memory_free_ext_desc_t_ptr_void_ptr *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_100;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_e8;
  undefined1 local_d0 [8];
  APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnMemFreeExtCb_t epilogue_callback_ptr;
  ze_pfnMemFreeExtCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_mem_free_ext_params_t tracerParams;
  ze_pfnMemFreeExt_t pfnFreeExt;
  void *ptr_local;
  ze_memory_free_ext_desc_t *pMemFreeDesc_local;
  ze_context_handle_t hContext_local;
  
  if (_DAT_002da638 ==
      (_func__ze_result_t__ze_context_handle_t_ptr__ze_memory_free_ext_desc_t_ptr_void_ptr *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnFreeExt = (ze_pfnMemFreeExt_t)ptr;
    ptr_local = pMemFreeDesc;
    pMemFreeDesc_local = (ze_memory_free_ext_desc_t *)hContext;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&pMemFreeDesc_local;
      APITracerCallbackDataImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnMemFreeExtCb_t)0x0;
            prologueCallbackPtr < (ze_pfnMemFreeExtCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x538);
          p_Var1 = *(_func_void__ze_mem_free_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr **)
                    (puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0xb90);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_mem_free_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr **)
                (puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_d0 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_d0)
          ;
        }
      }
      zeApiPtr = _DAT_002da638;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_e8,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_100,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hContext_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,_ze_memory_free_ext_desc_t_const*,void*),_ze_mem_free_ext_params_t*,void(*)(_ze_mem_free_ext_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_free_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_free_ext_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_free_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_free_ext_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,_ze_memory_free_ext_desc_t_const*&,void*&>
                     (zeApiPtr,(_ze_mem_free_ext_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_mem_free_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *
                      )currentTracerArray,&local_e8,&local_100,
                      (_ze_context_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_ze_memory_free_ext_desc_t **)&ptr_local,&pfnFreeExt);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_100);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_e8);
      APITracerCallbackDataImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_mem_free_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hContext_local._4_4_ =
           (*_DAT_002da638)((_ze_context_handle_t *)pMemFreeDesc_local,
                            (_ze_memory_free_ext_desc_t *)ptr_local,pfnFreeExt);
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemFreeExt(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const ze_memory_free_ext_desc_t* pMemFreeDesc,  ///< [in] pointer to memory free descriptor
        void* ptr                                       ///< [in][release] pointer to memory to free
        )
    {
        auto pfnFreeExt = context.zeDdiTable.Mem.pfnFreeExt;

        if( nullptr == pfnFreeExt)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Mem.pfnFreeExt, hContext, pMemFreeDesc, ptr);

        // capture parameters
        ze_mem_free_ext_params_t tracerParams = {
            &hContext,
            &pMemFreeDesc,
            &ptr
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnMemFreeExtCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnMemFreeExtCb_t, Mem, pfnFreeExtCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Mem.pfnFreeExt,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.ppMemFreeDesc,
                                                  *tracerParams.pptr);
    }